

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O2

bool __thiscall
rapidjson::
GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::HandleRefSchema(GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                  *this,PointerType *source,SchemaType **schema,ValueType *v,ValueType *document,
                 UriType *id)

{
  UriType *baseuri;
  IRemoteSchemaDocumentProviderType *pIVar1;
  SchemaErrorCode code;
  bool bVar2;
  SizeType SVar3;
  ValueType *name;
  ConstMemberIterator CVar4;
  ConstMemberIterator CVar5;
  GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  **ppGVar6;
  ValueType *pVVar7;
  GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  *this_00;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *v_00;
  SchemaType *pSVar8;
  uint uVar9;
  PointerType *pPVar10;
  PointerType pointer_2;
  PointerType relPointer;
  UriType ref;
  PointerType pointer;
  size_t unresolvedTokenIndex;
  UriType scopeId;
  PointerType local_e8;
  Stack<rapidjson::CrtAllocator> local_a8;
  GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  local_78;
  
  name = internal::
         Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
         ::GetRefString();
  CVar4 = GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
          ::FindMember<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                    ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      *)v,name);
  CVar5 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::MemberEnd(v);
  if (CVar4.ptr_ == CVar5.ptr_) goto LAB_001215ae;
  local_a8.stack_ = (char *)0x0;
  local_a8.stackTop_ = (char *)0x0;
  local_a8.allocator_ = (CrtAllocator *)0x0;
  local_a8.ownAllocator_ = (CrtAllocator *)0x0;
  local_a8.stackEnd_ = (char *)0x0;
  local_a8.initialCapacity_ = 0x100;
  GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
  ::Stringify<true,rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>>
            ((GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
              *)source,
             (GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_a8);
  ppGVar6 = internal::Stack<rapidjson::CrtAllocator>::
            Push<rapidjson::GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>const*>
                      (&this->schemaRef_,1);
  *ppGVar6 = source;
  if ((undefined1  [16])
      ((undefined1  [16])((CVar4.ptr_)->value).data_ & (undefined1  [16])0x400000000000000) ==
      (undefined1  [16])0x0) {
LAB_00121580:
    pSVar8 = this->typeless_;
    if (schema != (SchemaType **)0x0) {
      *schema = pSVar8;
    }
    AddSchemaRefs(this,pSVar8);
  }
  else {
    SVar3 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetStringLength(&(CVar4.ptr_)->value);
    if (SVar3 == 0) {
      SchemaError(this,kSchemaErrorRefInvalid,source);
      goto LAB_00121580;
    }
    GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::GenericUri(&scopeId,id,this->allocator_);
    GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
    ::
    GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
              ((GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
                *)&pointer_2,&(CVar4.ptr_)->value,this->allocator_);
    GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::Resolve(&ref,(GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                    *)&pointer_2,&scopeId,this->allocator_);
    GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::~GenericUri((GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                   *)&pointer_2);
    baseuri = &this->docId_;
    local_e8.tokenCount_ = 0;
    local_e8.parseErrorOffset_ = 0;
    local_e8.parseErrorCode_ = kPointerParseErrorNone;
    local_e8.nameBuffer_ = (Ch *)0x0;
    local_e8.tokens_ = (Token *)0x0;
    local_e8.allocator_ = (CrtAllocator *)0x0;
    local_e8.ownAllocator_ = (CrtAllocator *)0x0;
    pointer_2.tokenCount_ = 0;
    pointer_2.parseErrorOffset_ = 0;
    pointer_2.nameBuffer_ = (Ch *)0x0;
    pointer_2.tokens_ = (Token *)0x0;
    pointer_2.allocator_ = (CrtAllocator *)0x0;
    pointer_2.ownAllocator_ = (CrtAllocator *)0x0;
    pointer_2.parseErrorCode_ = kPointerParseErrorNone;
    pVVar7 = FindId(this,document,&ref,&local_e8,baseuri,false,&pointer_2);
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::~GenericPointer(&pointer_2);
    if (pVVar7 == (ValueType *)0x0) {
      pIVar1 = this->remoteProvider_;
      if (pIVar1 == (IRemoteSchemaDocumentProviderType *)0x0) {
        SchemaError(this,kSchemaErrorRefNoRemoteProvider,source);
      }
      else {
        GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
        ::GenericUri(&local_78,&ref);
        this_00 = (GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                   *)(**(code **)(*(long *)pIVar1 + 0x18))(pIVar1,&local_78,&this->spec_);
        GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
        ::~GenericUri(&local_78);
        if (this_00 !=
            (GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
             *)0x0) {
          SVar3 = GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                  ::GetFragStringLength(&ref);
          if ((1 < SVar3) && (ref.frag_[1] != '/')) {
            SchemaErrorValue(this,kSchemaErrorRefPlainName,source,ref.frag_,SVar3);
            goto LAB_00121559;
          }
          GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
          ::GenericPointer(&pointer_2,ref.frag_,(ulong)SVar3,this->allocator_);
          if (pointer_2.parseErrorCode_ == kPointerParseErrorNone) {
            pSVar8 = GetSchema(this_00,&pointer_2);
            if (pSVar8 != (SchemaType *)0x0) {
              if (schema != (SchemaType **)0x0) {
                *schema = pSVar8;
              }
              AddSchemaRefs(this,pSVar8);
              pPVar10 = &pointer_2;
              goto LAB_0012162e;
            }
            SVar3 = GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                    ::GetStringLength(&ref);
            SchemaErrorValue(this,kSchemaErrorRefUnknown,source,ref.uri_,SVar3);
          }
          else {
            SchemaErrorPointer(this,kSchemaErrorRefPointerInvalid,source,ref.frag_,SVar3,&pointer_2)
            ;
          }
          pPVar10 = &pointer_2;
          goto LAB_00121554;
        }
        SVar3 = GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                ::GetStringLength(&ref);
        SchemaErrorValue(this,kSchemaErrorRefNoRemoteSchema,source,ref.uri_,SVar3);
      }
LAB_00121559:
      GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
      ::~GenericPointer(&local_e8);
      GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
      ::~GenericUri(&ref);
      GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
      ::~GenericUri(&scopeId);
      goto LAB_00121580;
    }
    SVar3 = GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
            ::GetFragStringLength(&ref);
    if ((1 < SVar3) && (ref.frag_[1] != '/')) {
      relPointer.allocator_ = this->allocator_;
      relPointer.ownAllocator_ = (CrtAllocator *)0x0;
      relPointer.nameBuffer_ = (Ch *)0x0;
      relPointer.tokens_ = (Token *)0x0;
      relPointer.tokenCount_._0_4_ = 0;
      relPointer.tokenCount_._4_4_ = 0;
      relPointer.parseErrorOffset_._0_4_ = 0;
      relPointer._44_8_ = 0;
      if (((this->spec_).oapi & 0xfffffffe) == kVersion20) {
        SchemaErrorValue(this,kSchemaErrorRefPlainName,source,ref.frag_,SVar3);
      }
      else {
        SVar3 = GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                ::GetBaseStringLength(&ref);
        GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
        ::GenericUri((GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                      *)&pointer_2,ref.base_,SVar3,this->allocator_);
        pVVar7 = FindId(this,pVVar7,&ref,&relPointer,(UriType *)&pointer_2,true,&local_e8);
        GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
        ::~GenericUri((GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                       *)&pointer_2);
        if (pVVar7 == (ValueType *)0x0) {
          code = kSchemaErrorRefUnknown;
        }
        else {
          bVar2 = IsCyclicRef(this,&relPointer);
          if (!bVar2) {
            GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
            ::GetUri((UriType *)&pointer_2,&relPointer,document,baseuri,(size_t *)&pointer,
                     this->allocator_);
            GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
            ::operator=(&scopeId,(GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                                  *)&pointer_2);
            GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
            ::~GenericUri((GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                           *)&pointer_2);
            CreateSchema(this,schema,&relPointer,pVVar7,document,&scopeId);
            goto LAB_00121629;
          }
          code = kSchemaErrorRefCyclical;
        }
        SVar3 = GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                ::GetStringLength(&ref);
        SchemaErrorValue(this,code,source,ref.uri_,SVar3);
      }
LAB_0012154f:
      pPVar10 = &relPointer;
LAB_00121554:
      GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
      ::~GenericPointer(pPVar10);
      goto LAB_00121559;
    }
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::GenericPointer(&relPointer,ref.frag_,(ulong)SVar3,this->allocator_);
    if (relPointer.parseErrorCode_ != kPointerParseErrorNone) {
      SchemaErrorPointer(this,kSchemaErrorRefPointerInvalid,source,ref.frag_,SVar3,&relPointer);
      goto LAB_0012154f;
    }
    v_00 = GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
           ::Get(&relPointer,pVVar7,(size_t *)0x0);
    if (v_00 == (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)0x0) {
      SVar3 = GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
              ::GetStringLength(&ref);
      SchemaErrorValue(this,kSchemaErrorRefUnknown,source,ref.uri_,SVar3);
      goto LAB_0012154f;
    }
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::GenericPointer(&pointer,&local_e8,this->allocator_);
    for (uVar9 = 0;
        (ulong)uVar9 < CONCAT44(relPointer.tokenCount_._4_4_,(undefined4)relPointer.tokenCount_);
        uVar9 = uVar9 + 1) {
      GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
      ::Append(&pointer_2,&pointer,relPointer.tokens_ + uVar9,this->allocator_);
      GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
      ::operator=(&pointer,&pointer_2);
      GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
      ::~GenericPointer(&pointer_2);
    }
    bVar2 = IsCyclicRef(this,&pointer);
    if (bVar2) {
      SVar3 = GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
              ::GetStringLength(&ref);
      SchemaErrorValue(this,kSchemaErrorRefCyclical,source,ref.uri_,SVar3);
    }
    else {
      GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
      ::GetUri((UriType *)&pointer_2,&pointer,document,baseuri,&unresolvedTokenIndex,
               this->allocator_);
      GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
      ::operator=(&scopeId,(GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                            *)&pointer_2);
      GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
      ::~GenericUri((GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                     *)&pointer_2);
      CreateSchema(this,schema,&pointer,v_00,document,&scopeId);
    }
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::~GenericPointer(&pointer);
    if (bVar2) goto LAB_0012154f;
LAB_00121629:
    pPVar10 = &relPointer;
LAB_0012162e:
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::~GenericPointer(pPVar10);
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::~GenericPointer(&local_e8);
    GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::~GenericUri(&ref);
    GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::~GenericUri(&scopeId);
  }
  internal::Stack<rapidjson::CrtAllocator>::Destroy(&local_a8);
LAB_001215ae:
  return CVar4.ptr_ != CVar5.ptr_;
}

Assistant:

bool HandleRefSchema(const PointerType& source, const SchemaType** schema, const ValueType& v, const ValueType& document, const UriType& id) {
        typename ValueType::ConstMemberIterator itr = v.FindMember(SchemaType::GetRefString());
        if (itr == v.MemberEnd())
            return false;

        GenericStringBuffer<EncodingType> sb;
        source.StringifyUriFragment(sb);
        RAPIDJSON_SCHEMA_PRINT(Method, "GenericSchemaDocument::HandleRefSchema", sb.GetString(), id.GetString());
        // Resolve the source pointer to the $ref'ed schema (finally)
        new (schemaRef_.template Push<SchemaRefPtr>()) SchemaRefPtr(&source);

        if (itr->value.IsString()) {
            SizeType len = itr->value.GetStringLength();
            if (len == 0)
                SchemaError(kSchemaErrorRefInvalid, source);
            else {
                // First resolve $ref against the in-scope id
                UriType scopeId = UriType(id, allocator_);
                UriType ref = UriType(itr->value, allocator_).Resolve(scopeId, allocator_);
                RAPIDJSON_SCHEMA_PRINT(SchemaIds, id.GetString(), itr->value.GetString(), ref.GetString());
                // See if the resolved $ref minus the fragment matches a resolved id in this document
                // Search from the root. Returns the subschema in the document and its absolute JSON pointer.
                PointerType basePointer = PointerType();
                const ValueType *base = FindId(document, ref, basePointer, docId_, false);
                if (!base) {
                    // Remote reference - call the remote document provider
                    if (!remoteProvider_)
                        SchemaError(kSchemaErrorRefNoRemoteProvider, source);
                    else {
                        if (const GenericSchemaDocument* remoteDocument = remoteProvider_->GetRemoteDocument(ref, spec_)) {
                            const Ch* s = ref.GetFragString();
                            len = ref.GetFragStringLength();
                            if (len <= 1 || s[1] == '/') {
                                // JSON pointer fragment, absolute in the remote schema
                                const PointerType pointer(s, len, allocator_);
                                if (!pointer.IsValid())
                                    SchemaErrorPointer(kSchemaErrorRefPointerInvalid, source, s, len, pointer);
                                else {
                                    // Get the subschema
                                    if (const SchemaType *sc = remoteDocument->GetSchema(pointer)) {
                                        if (schema)
                                            *schema = sc;
                                        AddSchemaRefs(const_cast<SchemaType *>(sc));
                                        return true;
                                    } else
                                        SchemaErrorValue(kSchemaErrorRefUnknown, source, ref.GetString(), ref.GetStringLength());
                                }
                            } else
                                // Plain name fragment, not allowed in remote schema
                                SchemaErrorValue(kSchemaErrorRefPlainName, source, s, len);
                        } else
                          SchemaErrorValue(kSchemaErrorRefNoRemoteSchema, source, ref.GetString(), ref.GetStringLength());
                    }
                }
                else { // Local reference
                    const Ch* s = ref.GetFragString();
                    len = ref.GetFragStringLength();
                    if (len <= 1 || s[1] == '/') {
                        // JSON pointer fragment, relative to the resolved URI
                        const PointerType relPointer(s, len, allocator_);
                        if (!relPointer.IsValid())
                            SchemaErrorPointer(kSchemaErrorRefPointerInvalid, source, s, len, relPointer);
                        else {
                            // Get the subschema
                            if (const ValueType *pv = relPointer.Get(*base)) {
                                // Now get the absolute JSON pointer by adding relative to base
                                PointerType pointer(basePointer, allocator_);
                                for (SizeType i = 0; i < relPointer.GetTokenCount(); i++)
                                    pointer = pointer.Append(relPointer.GetTokens()[i], allocator_);
                                if (IsCyclicRef(pointer))
                                    SchemaErrorValue(kSchemaErrorRefCyclical, source, ref.GetString(), ref.GetStringLength());
                                else {
                                    // Call CreateSchema recursively, but first compute the in-scope id for the $ref target as we have jumped there
                                    // TODO: cache pointer <-> id mapping
                                    size_t unresolvedTokenIndex;
                                    scopeId = pointer.GetUri(document, docId_, &unresolvedTokenIndex, allocator_);
                                    CreateSchema(schema, pointer, *pv, document, scopeId);
                                    return true;
                                }
                            } else
                                SchemaErrorValue(kSchemaErrorRefUnknown, source, ref.GetString(), ref.GetStringLength());
                        }
                    } else {
                        // Plain name fragment, relative to the resolved URI
                        // Not supported in open api 2.0 and 3.0
                        PointerType pointer(allocator_);
                        if (spec_.oapi == kVersion20 || spec_.oapi == kVersion30)
                            SchemaErrorValue(kSchemaErrorRefPlainName, source, s, len);
                        // See if the fragment matches an id in this document.
                        // Search from the base we just established. Returns the subschema in the document and its absolute JSON pointer.
                        else if (const ValueType *pv = FindId(*base, ref, pointer, UriType(ref.GetBaseString(), ref.GetBaseStringLength(), allocator_), true, basePointer)) {
                            if (IsCyclicRef(pointer))
                                SchemaErrorValue(kSchemaErrorRefCyclical, source, ref.GetString(), ref.GetStringLength());
                            else {
                                // Call CreateSchema recursively, but first compute the in-scope id for the $ref target as we have jumped there
                                // TODO: cache pointer <-> id mapping
                                size_t unresolvedTokenIndex;
                                scopeId = pointer.GetUri(document, docId_, &unresolvedTokenIndex, allocator_);
                                CreateSchema(schema, pointer, *pv, document, scopeId);
                                return true;
                            }
                        } else
                            SchemaErrorValue(kSchemaErrorRefUnknown, source, ref.GetString(), ref.GetStringLength());
                    }
                }
            }
        }

        // Invalid/Unknown $ref
        if (schema)
            *schema = typeless_;
        AddSchemaRefs(typeless_);
        return true;
    }